

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

void __thiscall cmXMLParser::ReportError(cmXMLParser *this,int line,int param_2,char *msg)

{
  ostream *poVar1;
  
  if (this->ReportCallback != (ReportFunction)0x0) {
    (*this->ReportCallback)(line,msg,this->ReportCallbackData);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error parsing XML in stream at line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void cmXMLParser::ReportError(int line, int /*unused*/, const char* msg)
{
  if (this->ReportCallback) {
    this->ReportCallback(line, msg, this->ReportCallbackData);
  } else {
    std::cerr << "Error parsing XML in stream at line " << line << ": " << msg
              << std::endl;
  }
}